

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O1

void sam_hdr_dump(SAM_hdr *hdr)

{
  ushort uVar1;
  SAM_hdr_type *pSVar2;
  int iVar3;
  undefined8 in_RAX;
  kh_sam_hdr_t *pkVar4;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  SAM_hdr_tag *pSVar8;
  ulong uVar9;
  SAM_hdr_item_s *pSVar10;
  char c [2];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  puts("===DUMP===");
  pkVar4 = hdr->h;
  if (pkVar4->n_buckets != 0) {
    uVar6 = 0;
    do {
      if ((pkVar4->flags[uVar6 >> 4] >> ((char)uVar6 * '\x02' & 0x1fU) & 3) == 0) {
        pSVar2 = pkVar4->vals[uVar6];
        uVar1 = (ushort)pkVar4->keys[uVar6];
        uStack_38 = CONCAT26(uVar1 << 8 | uVar1 >> 8,(undefined6)uStack_38);
        printf("Type %.2s, count %d\n",(long)&uStack_38 + 6,(ulong)(pSVar2->prev->order + 1));
        pSVar10 = pSVar2;
        do {
          printf(">>>%d ",(ulong)(uint)pSVar10->order);
          for (pSVar8 = pSVar10->tag; pSVar8 != (SAM_hdr_tag *)0x0; pSVar8 = pSVar8->next) {
            printf("\"%.2s\":\"%.*s\"\t",pSVar8->str,(ulong)(pSVar8->len - 3),pSVar8->str + 3);
          }
          putchar(10);
          pSVar10 = pSVar10->next;
        } while (pSVar10 != pSVar2);
      }
      uVar6 = uVar6 + 1;
      pkVar4 = hdr->h;
    } while (uVar6 != pkVar4->n_buckets);
  }
  puts("\n@PG chains:");
  if (0 < hdr->npg_end) {
    uVar9 = 0;
    do {
      printf("  %d:",uVar9 & 0xffffffff);
      iVar3 = hdr->pg_end[uVar9];
      while (iVar3 != -1) {
        pcVar7 = "->";
        if (iVar3 == hdr->pg_end[uVar9]) {
          pcVar7 = " ";
        }
        lVar5 = (long)iVar3;
        printf("%s%d(%.*s)",pcVar7,lVar5,(ulong)(uint)hdr->pg[lVar5].name_len,hdr->pg[lVar5].name);
        iVar3 = hdr->pg[lVar5].prev_id;
      }
      putchar(10);
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)hdr->npg_end);
  }
  puts("===END DUMP===");
  return;
}

Assistant:

void sam_hdr_dump(SAM_hdr *hdr) {
    khint_t k;
    int i;

    printf("===DUMP===\n");
    for (k = kh_begin(hdr->h); k != kh_end(hdr->h); k++) {
	SAM_hdr_type *t1, *t2;
	char c[2];

	if (!kh_exist(hdr->h, k))
	    continue;

	t1 = t2 = kh_val(hdr->h, k);
	c[0] = kh_key(hdr->h, k)>>8;
	c[1] = kh_key(hdr->h, k)&0xff;
	printf("Type %.2s, count %d\n", c, t1->prev->order+1);

	do {
	    SAM_hdr_tag *tag;
	    printf(">>>%d ", t1->order);
	    for (tag = t1->tag; tag; tag=tag->next) {
		printf("\"%.2s\":\"%.*s\"\t",
		       tag->str, tag->len-3, tag->str+3);
	    }
	    putchar('\n');
	    t1 = t1->next;
	} while (t1 != t2);
    }

    /* Dump out PG chains */
    printf("\n@PG chains:\n");
    for (i = 0; i < hdr->npg_end; i++) {
	int j;
	printf("  %d:", i);
	for (j = hdr->pg_end[i]; j != -1; j = hdr->pg[j].prev_id) {
	    printf("%s%d(%.*s)", 
		   j == hdr->pg_end[i] ? " " : "->",
		   j, hdr->pg[j].name_len, hdr->pg[j].name);
	}
	printf("\n");
    }

    puts("===END DUMP===");
}